

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O1

void soplex::
     updateRes<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *facset,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *resvecprev,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *resvec,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *tmpvec,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eprev,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *qcurr,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  undefined1 local_a8 [16];
  undefined1 local_98 [13];
  undefined3 uStack_8b;
  undefined1 auStack_88 [13];
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_128.data._M_elems._32_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 8);
  auVar2 = *(undefined1 (*) [16])(eprev->m_backend).data._M_elems;
  local_128.data._M_elems._16_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 4);
  uVar1 = *(undefined8 *)((eprev->m_backend).data._M_elems + 6);
  local_128.data._M_elems._24_5_ = SUB85(uVar1,0);
  local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
  local_128.exp = (eprev->m_backend).exp;
  local_128.neg = (eprev->m_backend).neg;
  local_128.fpclass = (eprev->m_backend).fpclass;
  local_128.prec_elem = (eprev->m_backend).prec_elem;
  local_e8.data._M_elems._32_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
  local_e8.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
  local_e8.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
  local_e8.data._M_elems._16_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
  local_e8.data._M_elems._24_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
  local_e8.exp = (epsilon->m_backend).exp;
  local_e8.neg = (epsilon->m_backend).neg;
  local_e8.fpclass = (epsilon->m_backend).fpclass;
  local_e8.prec_elem = (epsilon->m_backend).prec_elem;
  if ((local_128.neg == true) &&
     (local_128.data._M_elems[0] = (uint)*(undefined8 *)(eprev->m_backend).data._M_elems,
     local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite)) {
    local_128.neg = false;
  }
  local_128.data._M_elems._0_16_ = auVar2;
  if (local_e8.fpclass == cpp_dec_float_NaN || local_128.fpclass == cpp_dec_float_NaN) {
LAB_0017ce6c:
    local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 8);
    local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eprev->m_backend).data._M_elems;
    local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 2);
    local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 4);
    local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 6);
    local_68.m_backend.exp = (eprev->m_backend).exp;
    local_68.m_backend.neg = (eprev->m_backend).neg;
    local_68.m_backend.fpclass = (eprev->m_backend).fpclass;
    local_68.m_backend.prec_elem = (eprev->m_backend).prec_elem;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)resvec,&local_68);
  }
  else {
    iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_128,&local_e8);
    if (0 < iVar3) goto LAB_0017ce6c;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(resvec);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(tmpvec);
  iVar3 = (resvecprev->super_IdxSet).num;
  if (iVar3 == 1) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)tmpvec,facset,resvecprev);
  }
  else {
    if ((tmpvec->setupStatus != true) ||
       ((double)(facset->set).thenum *
        (double)((int)((ulong)((long)(tmpvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(tmpvec->
                                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249)
        * 0.5 < (double)(facset->
                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ).thesize * (double)iVar3)) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      assign2productFull<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)tmpvec,facset,resvecprev);
      tmpvec->setupStatus = false;
      goto LAB_0017cf35;
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign2productShort<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)tmpvec,facset,resvecprev);
  }
  tmpvec->setupStatus = true;
LAB_0017cf35:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(tmpvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)resvec,tmpvec);
  local_78._0_4_ = cpp_dec_float_finite;
  local_78._4_4_ = 10;
  local_a8 = (undefined1  [16])0x0;
  local_98 = SUB1613((undefined1  [16])0x0,0);
  uStack_8b = 0;
  auStack_88 = SUB1613((undefined1  [16])0x0,3);
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems._24_5_ = 0;
  local_128.data._M_elems[7]._1_3_ = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_128,-1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_a8,&local_128,&qcurr->m_backend);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)resvec,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_a8);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(resvec);
  return;
}

Assistant:

static inline void updateRes(
   const SVSetBase<R> facset,
   const SSVectorBase<R> resvecprev,
   SSVectorBase<R>& resvec,
   SSVectorBase<R>& tmpvec,
   R eprev,
   R qcurr,
   R epsilon)
{
   assert(qcurr != 0.0);

   if(isZero(eprev, epsilon))
      resvec.clear();
   else
      resvec *= eprev;

   int dummy1 = 0;
   int dummy2 = 0;
   tmpvec.assign2product4setup(facset, resvecprev, nullptr, nullptr, dummy1, dummy2);
   tmpvec.setup();
   resvec += tmpvec;

   resvec *= (-1.0 / qcurr);
   resvec.setup();
}